

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::execMove2<(moira::Instr)71,(moira::Mode)0,(moira::Size)2>(Moira *this,u16 opcode)

{
  ushort uVar1;
  bool bVar2;
  
  uVar1 = *(ushort *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58);
  (this->reg).sr.n = 0x7fff < uVar1;
  (this->reg).sr.z = uVar1 == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  bVar2 = writeOp<(moira::Mode)2,(moira::Size)2,64ul>(this,opcode >> 9 & 7,(uint)uVar1);
  if (bVar2) {
    (this->reg).sr.n = 0x7fff < uVar1;
    (this->reg).sr.z = uVar1 == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    prefetch<4ul>(this);
    return;
  }
  return;
}

Assistant:

void
Moira::execMove2(u16 opcode)
{
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp <M,S,STD_AE_FRAME> (src, ea, data)) return;
    
    if (S == Word || (M != MODE_DN && M != MODE_AN && M != MODE_IM)) {
        reg.sr.n = NBIT<Word>(data);
        reg.sr.z = ZERO<Word>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;
    }
        
    if (!writeOp <MODE_AI,S,AE_INC_PC> (dst, data)) return;
    
    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;

    prefetch<POLLIPL>();
}